

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_pubkey_sort(secp256k1_context *ctx,secp256k1_pubkey **pubkeys,size_t n_pubkeys)

{
  secp256k1_pubkey_sort_cmp_data cmp_data;
  secp256k1_context *local_8;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_pubkey_sort_cold_2();
  }
  else if (pubkeys != (secp256k1_pubkey **)0x0) {
    local_8 = ctx;
    secp256k1_hsort(pubkeys,n_pubkeys,8,secp256k1_pubkey_sort_cmp,&local_8);
    return 1;
  }
  secp256k1_pubkey_sort_cold_1();
  return 0;
}

Assistant:

int secp256k1_pubkey_sort(const secp256k1_context* ctx, const secp256k1_pubkey **pubkeys, size_t n_pubkeys) {
    secp256k1_pubkey_sort_cmp_data cmp_data;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);

    cmp_data.ctx = ctx;

    /* Suppress wrong warning (fixed in MSVC 19.33) */
    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(push)
    #pragma warning(disable: 4090)
    #endif

    secp256k1_hsort(pubkeys, n_pubkeys, sizeof(*pubkeys), secp256k1_pubkey_sort_cmp, &cmp_data);

    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(pop)
    #endif

    return 1;
}